

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmArray(ExpressionContext *ctx,VmModule *module,ExprArray *node)

{
  TypeBase *type;
  Allocator *pAVar1;
  SynBase *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  VmInstruction *argument;
  VmConstant *value;
  VmValue *value_00;
  VmConstant *arrayLength;
  VmConstant *elementSize;
  VmConstant *index;
  TypeRef *structType;
  VmValue *address;
  VmInstruction *instruction;
  ExprBase *pEVar4;
  TypeBase *pTVar5;
  uint uVar6;
  VmType VVar7;
  VmValue *in_stack_ffffffffffffff98;
  
  pTVar5 = (node->super_ExprBase).type;
  if ((pTVar5 != (TypeBase *)0x0) && (pTVar5->typeID == 0x13)) {
    type = (TypeBase *)pTVar5[1]._vptr_TypeBase;
    if (((type == ctx->typeBool) || (type == ctx->typeChar)) || (type == ctx->typeShort)) {
      uVar6 = 1;
      value = anon_unknown.dwarf_107107::CreateAlloca
                        (ctx,module,(node->super_ExprBase).source,pTVar5,"arr_lit",true);
      pEVar4 = (node->values).head;
      if (pEVar4 != (ExprBase *)0x0) {
        iVar3 = 0;
        do {
          value_00 = CompileVm(ctx,module,pEVar4);
          arrayLength = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                          pTVar5[1].typeID);
          elementSize = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                          (int)type->size);
          index = CreateConstantInt(module->allocator,(node->super_ExprBase).source,iVar3);
          pSVar2 = (node->super_ExprBase).source;
          structType = ExpressionContext::GetReferenceType(ctx,type);
          address = anon_unknown.dwarf_107107::CreateIndex
                              (module,pSVar2,&arrayLength->super_VmValue,&elementSize->super_VmValue
                               ,&value->super_VmValue,&index->super_VmValue,
                               &structType->super_TypeBase);
          anon_unknown.dwarf_107107::CreateStore
                    (ctx,module,(node->super_ExprBase).source,type,address,value_00,0);
          uVar6 = (uint)value_00;
          iVar3 = iVar3 + 1;
          pEVar4 = pEVar4->next;
        } while (pEVar4 != (ExprBase *)0x0);
      }
      instruction = (VmInstruction *)
                    anon_unknown.dwarf_107107::CreateLoad
                              (ctx,module,(node->super_ExprBase).source,pTVar5,&value->super_VmValue
                               ,uVar6);
      pTVar5 = (node->super_ExprBase).type;
    }
    else {
      iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x138);
      instruction = (VmInstruction *)CONCAT44(extraout_var,iVar3);
      pAVar1 = module->allocator;
      VVar7 = GetVmType(ctx,(node->super_ExprBase).type);
      pSVar2 = (node->super_ExprBase).source;
      uVar6 = module->currentFunction->nextInstructionId;
      module->currentFunction->nextInstructionId = uVar6 + 1;
      (instruction->super_VmValue).typeID = 2;
      (instruction->super_VmValue).type = VVar7;
      (instruction->super_VmValue).source = pSVar2;
      (instruction->super_VmValue).comment.begin = (char *)0x0;
      (instruction->super_VmValue).comment.end = (char *)0x0;
      (instruction->super_VmValue).users.allocator = pAVar1;
      (instruction->super_VmValue).users.data = (instruction->super_VmValue).users.little;
      (instruction->super_VmValue).users.count = 0;
      (instruction->super_VmValue).users.max = 8;
      (instruction->super_VmValue).hasKnownNonSimpleUse = false;
      (instruction->super_VmValue).hasSideEffects = false;
      (instruction->super_VmValue).hasMemoryAccess = false;
      (instruction->super_VmValue).canBeRemoved = true;
      (instruction->super_VmValue).hasKnownSimpleUse = false;
      (instruction->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmInstruction_00224cd8;
      instruction->cmd = VM_INST_ARRAY;
      instruction->uniqueId = uVar6;
      (instruction->arguments).allocator = pAVar1;
      (instruction->arguments).data = (instruction->arguments).little;
      (instruction->arguments).count = 0;
      (instruction->arguments).max = 4;
      (instruction->regVmRegisters).allocator = pAVar1;
      (instruction->regVmRegisters).data = (instruction->regVmRegisters).little;
      (instruction->regVmRegisters).max = 8;
      (instruction->regVmRegisters).count = 0;
      instruction->parent = (VmBlock *)0x0;
      instruction->prevSibling = (VmInstruction *)0x0;
      *(undefined8 *)((long)&instruction->prevSibling + 1) = 0;
      *(undefined8 *)((long)&instruction->nextSibling + 1) = 0;
      instruction->regVmCompletedUsers = 0;
      instruction->regVmSearchMarker = 0;
      instruction->color = 0;
      instruction->marker = 0;
      instruction->idom = (VmInstruction *)0x0;
      instruction->intersectingIdom = (VmInstruction *)0x0;
      for (pEVar4 = (node->values).head; pEVar4 != (ExprBase *)0x0; pEVar4 = pEVar4->next) {
        argument = (VmInstruction *)CompileVm(ctx,module,pEVar4);
        if (type == ctx->typeFloat) {
          argument = anon_unknown.dwarf_107107::CreateInstruction
                               ((anon_unknown_dwarf_107107 *)module,
                                (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                                (VmType)(ZEXT816(0x11) << 0x40),(VmInstructionType)argument,
                                (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                in_stack_ffffffffffffff98);
        }
        VmInstruction::AddArgument(instruction,&argument->super_VmValue);
      }
      VmBlock::AddInstruction(module->currentBlock,instruction);
      pTVar5 = (node->super_ExprBase).type;
    }
    anon_unknown.dwarf_107107::CheckType(ctx,(ExprBase *)pTVar5,&instruction->super_VmValue);
    return &instruction->super_VmValue;
  }
  __assert_fail("isType<TypeArray>(node->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xa23,"VmValue *CompileVmArray(ExpressionContext &, VmModule *, ExprArray *)");
}

Assistant:

VmValue* CompileVmArray(ExpressionContext &ctx, VmModule *module, ExprArray *node)
{
	assert(isType<TypeArray>(node->type));

	TypeArray *typeArray = getType<TypeArray>(node->type);

	TypeBase *elementType = typeArray->subType;

	if(elementType == ctx.typeBool || elementType == ctx.typeChar || elementType == ctx.typeShort)
	{
		VmValue *storage = CreateAlloca(ctx, module, node->source, typeArray, "arr_lit", true);

		unsigned i = 0;

		for(ExprBase *value = node->values.head; value; value = value->next)
		{
			VmValue *element = CompileVm(ctx, module, value);

			VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(typeArray->length));
			VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(elementType->size));
			VmValue *index = CreateConstantInt(module->allocator, node->source, i);

			VmValue *address = CreateIndex(module, node->source, arrayLength, elementSize, storage, index, ctx.GetReferenceType(elementType));

			CreateStore(ctx, module, node->source, elementType, address, element, 0);

			i++;
		}

		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, typeArray, storage, 0));
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_ARRAY, module->currentFunction->nextInstructionId++);

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		VmValue *element = CompileVm(ctx, module, value);

		if(elementType == ctx.typeFloat)
			element = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, element);

		inst->AddArgument(element);
	}

	module->currentBlock->AddInstruction(inst);

	return CheckType(ctx, node, inst);
}